

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decallib.cpp
# Opt level: O2

void __thiscall FDecalLib::ParseColorchanger(FDecalLib *this,FScanner *sc)

{
  bool bVar1;
  FDecalColorerAnim *this_00;
  uint32 local_4c;
  int local_48;
  int local_44;
  FString faderName;
  FDecalColorerAnim *local_38;
  
  faderName.Chars = FString::NullString.Nothing;
  FString::NullString.RefCount = FString::NullString.RefCount + 1;
  FScanner::MustGetString(sc);
  FString::operator=(&faderName,sc->String);
  FScanner::MustGetStringName(sc,"{");
  local_4c = 0;
  local_48 = 0;
  local_44 = 0;
  while( true ) {
    FScanner::MustGetString(sc);
    bVar1 = FScanner::Compare(sc,"}");
    if (bVar1) break;
    bVar1 = FScanner::Compare(sc,"FadeStart");
    if (bVar1) {
      FScanner::MustGetFloat(sc);
      local_44 = (int)(sc->Float * 35.0);
    }
    else {
      bVar1 = FScanner::Compare(sc,"FadeTime");
      if (bVar1) {
        FScanner::MustGetFloat(sc);
        local_48 = (int)(sc->Float * 35.0);
      }
      else {
        bVar1 = FScanner::Compare(sc,"Color");
        if (bVar1) {
          FScanner::MustGetString(sc);
          local_4c = V_GetColor((DWORD *)0x0,sc);
        }
        else {
          FScanner::ScriptError(sc,"Unknown color changer parameter \'%s\'",sc->String);
        }
      }
    }
  }
  this_00 = (FDecalColorerAnim *)operator_new(0x18);
  FDecalColorerAnim::FDecalColorerAnim(this_00,faderName.Chars);
  *(int *)&(this_00->super_FDecalAnimator).field_0xc = local_44;
  this_00->DecayTime = local_48;
  (this_00->GoalColor).field_0.d = local_4c;
  local_38 = this_00;
  TArray<FDecalAnimator_*,_FDecalAnimator_*>::Push
            (&Animators.super_TArray<FDecalAnimator_*,_FDecalAnimator_*>,
             (FDecalAnimator **)&local_38);
  FString::~FString(&faderName);
  return;
}

Assistant:

void FDecalLib::ParseColorchanger (FScanner &sc)
{
	FString faderName;
	int startTime = 0, decayTime = 0;
	PalEntry goal = 0;

	sc.MustGetString ();
	faderName = sc.String;
	sc.MustGetStringName ("{");
	
	for (;;)
	{
		sc.MustGetString ();
		if (sc.Compare ("}"))
		{
			FDecalColorerAnim *fader = new FDecalColorerAnim (faderName);
			fader->DecayStart = startTime;
			fader->DecayTime = decayTime;
			fader->GoalColor = goal;
			Animators.Push (fader);
			break;
		}
		else if (sc.Compare ("FadeStart"))
		{
			sc.MustGetFloat ();
			startTime = (int)(sc.Float * TICRATE);
		}
		else if (sc.Compare ("FadeTime"))
		{
			sc.MustGetFloat ();
			decayTime = (int)(sc.Float * TICRATE);
		}
		else if (sc.Compare ("Color"))
		{
			sc.MustGetString ();
			goal = V_GetColor (NULL, sc);
		}
		else
		{
			sc.ScriptError ("Unknown color changer parameter '%s'", sc.String);
		}
	}
}